

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O3

void net_uv::TCPSocket::uv_on_after_read(uv_stream_t *handle,ssize_t nread,uv_buf_t *buf)

{
  long *plVar1;
  ssize_t local_20;
  char *local_18;
  
  plVar1 = (long *)handle->data;
  if (nread < 1) {
    (**(code **)(*plVar1 + 0x38))(plVar1);
    Socket::uv_on_free_buffer((uv_handle_t *)handle,buf);
    return;
  }
  local_18 = buf->base;
  local_20 = nread;
  if (plVar1[0x12] != 0) {
    (*(code *)plVar1[0x13])(plVar1 + 0x10,&local_18,&local_20);
    Socket::uv_on_free_buffer((uv_handle_t *)handle,buf);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void TCPSocket::uv_on_after_read(uv_stream_t *handle, ssize_t nread, const uv_buf_t *buf) 
{
	TCPSocket* s = (TCPSocket*)handle->data;
	if (nread <= 0) 
	{
		s->disconnect();
		uv_on_free_buffer((uv_handle_t*)handle, buf);
		return;
	}
	s->m_recvCall(buf->base, nread);
	uv_on_free_buffer((uv_handle_t*)handle, buf);
}